

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysp_type_enum_free(lysf_ctx *ctx,lysp_type_enum *item)

{
  lysp_qname *plVar1;
  lysp_ext_instance *plVar2;
  uint64_t c__;
  ulong uVar3;
  lysp_ext_instance *plVar4;
  long lVar5;
  
  lydict_remove(ctx->ctx,item->name);
  lydict_remove(ctx->ctx,item->dsc);
  lydict_remove(ctx->ctx,item->ref);
  lVar5 = 0;
  uVar3 = 0;
  do {
    plVar1 = item->iffeatures;
    if (plVar1 == (lysp_qname *)0x0) {
LAB_00157f92:
      lVar5 = 0;
      plVar4 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar2 = item->exts;
        if (plVar2 == (lysp_ext_instance *)0x0) {
          return;
        }
        if (plVar2[-1].exts <= plVar4) break;
        lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar2->name + lVar5));
        plVar4 = (lysp_ext_instance *)((long)&plVar4->name + 1);
        lVar5 = lVar5 + 0x70;
      }
      free(&plVar2[-1].exts);
      return;
    }
    if (*(ulong *)&plVar1[-1].flags <= uVar3) {
      free(&plVar1[-1].flags);
      goto LAB_00157f92;
    }
    lysp_qname_free(ctx->ctx,(lysp_qname *)((long)&plVar1->str + lVar5));
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + 0x18;
  } while( true );
}

Assistant:

static void
lysp_type_enum_free(struct lysf_ctx *ctx, struct lysp_type_enum *item)
{
    lydict_remove(ctx->ctx, item->name);
    lydict_remove(ctx->ctx, item->dsc);
    lydict_remove(ctx->ctx, item->ref);
    FREE_ARRAY(ctx->ctx, item->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, item->exts, lysp_ext_instance_free);
}